

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O3

void __thiscall Restaurant::goMove(Restaurant *this,string *details)

{
  int iVar1;
  iterator __position;
  int *piVar2;
  size_type sVar3;
  long lVar4;
  MoveCustomer *pMVar5;
  undefined8 uVar6;
  string delimiterSpace;
  string token1;
  MoveCustomer *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 local_78 [16];
  MoveCustomer *local_68;
  undefined8 local_60;
  char local_58;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88," ","");
  local_68 = (MoveCustomer *)&local_58;
  local_60 = 0;
  local_58 = '\0';
  std::__cxx11::string::find((char *)details,(ulong)local_88,0);
  std::__cxx11::string::substr((ulong)local_a8,(ulong)details);
  local_40._8_8_ = this;
  std::__cxx11::string::operator=((string *)&local_68,(string *)local_a8);
  if (local_a8[0] != (MoveCustomer *)local_98) {
    operator_delete(local_a8[0]);
  }
  pMVar5 = local_68;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  sVar3 = strtol((char *)pMVar5,(char **)local_a8,10);
  if (local_a8[0] == pMVar5) {
    std::__throw_invalid_argument("stoi");
LAB_0010aac9:
    std::__throw_out_of_range("stoi");
LAB_0010aad5:
    std::__throw_invalid_argument("stoi");
LAB_0010aae1:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((long)(int)sVar3 != sVar3) || (*piVar2 == 0x22)) goto LAB_0010aac9;
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    local_40._M_allocated_capacity = sVar3;
    std::__cxx11::string::erase((ulong)details,0);
    std::__cxx11::string::find((char *)details,(ulong)local_88,0);
    std::__cxx11::string::substr((ulong)local_a8,(ulong)details);
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_a8);
    if (local_a8[0] != (MoveCustomer *)local_98) {
      operator_delete(local_a8[0]);
    }
    pMVar5 = local_68;
    iVar1 = *piVar2;
    *piVar2 = 0;
    sVar3 = strtol((char *)local_68,(char **)local_a8,10);
    if (local_a8[0] == pMVar5) goto LAB_0010aad5;
    if ((sVar3 - 0x80000000 < 0xffffffff00000000) || (*piVar2 == 0x22)) goto LAB_0010aae1;
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    local_48 = sVar3;
    std::__cxx11::string::erase((ulong)details,0);
    std::__cxx11::string::find((char *)details,(ulong)local_88,0);
    std::__cxx11::string::substr((ulong)local_a8,(ulong)details);
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_a8);
    if (local_a8[0] != (MoveCustomer *)local_98) {
      operator_delete(local_a8[0]);
    }
    pMVar5 = local_68;
    iVar1 = *piVar2;
    *piVar2 = 0;
    lVar4 = strtol((char *)local_68,(char **)local_a8,10);
    if (local_a8[0] != pMVar5) {
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar2 != 0x22)) {
        if (*piVar2 == 0) {
          *piVar2 = iVar1;
        }
        std::__cxx11::string::erase((ulong)details,0);
        pMVar5 = (MoveCustomer *)operator_new(0x38);
        uVar6 = local_40._8_8_;
        MoveCustomer::MoveCustomer
                  (pMVar5,(int)local_40._M_allocated_capacity,(int)local_48,(int)lVar4);
        (**(pMVar5->super_BaseAction)._vptr_BaseAction)(pMVar5,uVar6);
        __position._M_current = *(pointer *)(uVar6 + 0x48);
        local_a8[0] = pMVar5;
        if (__position._M_current == *(pointer *)(uVar6 + 0x50)) {
          std::vector<BaseAction*,std::allocator<BaseAction*>>::_M_realloc_insert<BaseAction*>
                    ((vector<BaseAction*,std::allocator<BaseAction*>> *)(uVar6 + 0x40),__position,
                     (BaseAction **)local_a8);
        }
        else {
          *__position._M_current = (BaseAction *)pMVar5;
          *(pointer *)(uVar6 + 0x48) = *(pointer *)(uVar6 + 0x48) + 1;
        }
        if (local_68 != (MoveCustomer *)&local_58) {
          operator_delete(local_68);
        }
        if (local_88 != local_78) {
          operator_delete(local_88);
        }
        return;
      }
      goto LAB_0010aaf9;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0010aaf9:
  uVar6 = std::__throw_out_of_range("stoi");
  if (local_68 != (MoveCustomer *)&local_58) {
    operator_delete(local_68);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void Restaurant::goMove(std::string details)
{
    int customerId;
    int tableId1;
    int tableId2;
    std::string delimiterSpace = " ";
    size_t pos1 = 0;
    std::string token1;
    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    customerId = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());


    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    tableId1 = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());

    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0, pos1);
    tableId2 = std::stoi(token1);
    details.erase(0, pos1 + delimiterSpace.length());

    auto * newMove = new MoveCustomer(customerId, tableId1, tableId2);
    newMove->act(*this);
    actionsLog.push_back(newMove);

}